

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O2

void absl::lts_20250127::internal_statusor::Helper::Crash(Status *status)

{
  string sStack_b8;
  string local_98;
  AlphaNum local_78;
  string_view local_48 [3];
  
  local_48[0] = NullSafeStringView("Attempting to fetch value instead of handling error ");
  Status::ToString_abi_cxx11_(&local_98,status,kDefault);
  local_78.piece_._M_len = local_98._M_string_length;
  local_78.piece_._M_str = local_98._M_dataplus._M_p;
  StrCat_abi_cxx11_(&sStack_b8,(lts_20250127 *)local_48,&local_78,
                    (AlphaNum *)local_98._M_string_length);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/status/statusor.cc"
             ,0x59,&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_98);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/status/statusor.cc"
                ,0x59,"static void absl::internal_statusor::Helper::Crash(const absl::Status &)");
}

Assistant:

void Helper::Crash(const absl::Status& status) {
  ABSL_INTERNAL_LOG(
      FATAL,
      absl::StrCat("Attempting to fetch value instead of handling error ",
                   status.ToString()));
}